

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O3

void __thiscall rsg::VariableManager::popValueScope(VariableManager *this)

{
  pointer *pppVVar1;
  _Rb_tree_header *p_Var2;
  pointer ppVVar3;
  pointer ppVVar4;
  mapped_type pVVar5;
  ValueScope *pVVar6;
  Variable *pVVar7;
  iterator __position;
  ValueEntry *pVVar8;
  Variable *pVVar9;
  ConstValueRangeAccess value;
  ConstValueRangeAccess value_00;
  _Base_ptr p_Var10;
  mapped_type *ppVVar11;
  __normal_iterator<rsg::ValueEntry_*const_*,_std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>_>
  _Var12;
  pointer ppVVar13;
  pointer ppVVar14;
  _Base_ptr p_Var15;
  _Rb_tree_header *p_Var16;
  pointer ppVVar17;
  ValueScope *this_00;
  _Base_ptr p_Var18;
  _Base_ptr p_Var19;
  pointer ppVVar20;
  Variable *var;
  ValueEntry *entry;
  map<const_rsg::Variable_*,_const_rsg::ValueEntry_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>_>
  oldValues;
  set<const_rsg::Variable_*,_std::less<const_rsg::Variable_*>,_std::allocator<const_rsg::Variable_*>_>
  addedVars;
  ValueRange intersectedValue;
  Variable *local_1a0;
  ValueScope *local_198;
  ValueScope *local_190;
  vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>> *local_188;
  ValueEntry *local_180;
  ConstValueRangeAccess local_178;
  pointer local_160;
  ConstValueRangeAccess local_158;
  ValueRange *local_140;
  Scalar *pSStack_138;
  Scalar *local_130;
  Variable **local_128;
  pointer pSStack_120;
  Scalar *local_118;
  _Rb_tree<const_rsg::Variable_*,_std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>,_std::_Select1st<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>_>
  local_110;
  _Rb_tree<const_rsg::Variable_*,_const_rsg::Variable_*,_std::_Identity<const_rsg::Variable_*>,_std::less<const_rsg::Variable_*>,_std::allocator<const_rsg::Variable_*>_>
  local_e0;
  ValueRange local_b0;
  
  ppVVar3 = (this->m_valueScopeStack).
            super__Vector_base<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppVVar4 = (this->m_entryCache).
            super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppVVar17 = ppVVar3 + -1;
  local_198 = ppVVar3[-1];
  (this->m_valueScopeStack).
  super__Vector_base<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppVVar17;
  if ((this->m_entryCache).
      super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVVar4) {
    (this->m_entryCache).
    super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVVar4;
  }
  ppVVar13 = (this->m_valueScopeStack).
             super__Vector_base<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppVVar13 != ppVVar17) {
    local_190 = ppVVar3[-2];
    local_110._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_110._M_impl.super__Rb_tree_header._M_header;
    local_110._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_110._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_110._M_impl.super__Rb_tree_header._M_node_count = 0;
    ppVVar20 = (local_198->m_entries).
               super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_110._M_impl.super__Rb_tree_header._M_header._M_right =
         local_110._M_impl.super__Rb_tree_header._M_header._M_left;
    if (ppVVar20 !=
        (local_198->m_entries).
        super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        pVVar5 = *ppVVar20;
        local_b0.m_type._0_8_ = pVVar5->m_variable;
        ppVVar11 = std::
                   map<const_rsg::Variable_*,_const_rsg::ValueEntry_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>_>
                   ::operator[]((map<const_rsg::Variable_*,_const_rsg::ValueEntry_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>_>
                                 *)&local_110,(key_type *)&local_b0);
        *ppVVar11 = pVVar5;
        ppVVar20 = ppVVar20 + 1;
      } while (ppVVar20 !=
               (local_198->m_entries).
               super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
      ppVVar13 = (this->m_valueScopeStack).
                 super__Vector_base<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppVVar17 = (this->m_valueScopeStack).
                 super__Vector_base<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    }
    p_Var2 = &local_e0._M_impl.super__Rb_tree_header;
    local_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_e0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_e0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    local_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
    if (ppVVar17 != ppVVar13) {
      local_188 = (vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>> *)
                  &this->m_entryCache;
      do {
        pVVar6 = ppVVar17[-1];
        ppVVar20 = (pVVar6->m_entries).
                   super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>._M_impl
                   .super__Vector_impl_data._M_start;
        ppVVar14 = (pVVar6->m_entries).
                   super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>._M_impl
                   .super__Vector_impl_data._M_finish;
        if (ppVVar20 != ppVVar14) {
          do {
            local_160 = ppVVar17;
            p_Var16 = &local_110._M_impl.super__Rb_tree_header;
            local_180 = *ppVVar20;
            local_1a0 = local_180->m_variable;
            p_Var10 = local_e0._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var19 = &p_Var2->_M_header;
            if (local_e0._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_005ab3e3:
              p_Var10 = local_110._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var19 = &p_Var16->_M_header;
              if (local_110._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_005ab42a:
                __position._M_current =
                     (this->m_entryCache).
                     super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (this->m_entryCache).
                    super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>>::
                  _M_realloc_insert<rsg::ValueEntry_const*const&>(local_188,__position,&local_180);
                }
                else {
                  *__position._M_current = local_180;
                  pppVVar1 = &(this->m_entryCache).
                              super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  *pppVVar1 = *pppVVar1 + 1;
                }
              }
              else {
                do {
                  p_Var18 = p_Var19;
                  p_Var15 = p_Var10;
                  pVVar7 = *(Variable **)(p_Var15 + 1);
                  p_Var19 = p_Var15;
                  if (pVVar7 < local_1a0) {
                    p_Var19 = p_Var18;
                  }
                  p_Var10 = (&p_Var15->_M_left)[pVVar7 < local_1a0];
                } while ((&p_Var15->_M_left)[pVVar7 < local_1a0] != (_Base_ptr)0x0);
                if ((_Rb_tree_header *)p_Var19 == p_Var16) goto LAB_005ab42a;
                if (pVVar7 < local_1a0) {
                  p_Var15 = p_Var18;
                }
                if (local_1a0 < *(Variable **)(p_Var15 + 1)) goto LAB_005ab42a;
                ppVVar11 = std::
                           map<const_rsg::Variable_*,_const_rsg::ValueEntry_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>_>
                           ::operator[]((map<const_rsg::Variable_*,_const_rsg::ValueEntry_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>_>
                                         *)&local_110,&local_1a0);
                pVVar5 = *ppVVar11;
                ValueRange::ValueRange(&local_b0,&local_1a0->m_type);
                local_178.m_min =
                     (local_180->m_valueRange).m_min.
                     super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                     super__Vector_impl_data._M_start;
                local_178.m_max =
                     (local_180->m_valueRange).m_max.
                     super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                     super__Vector_impl_data._M_start;
                if (local_178.m_min ==
                    (local_180->m_valueRange).m_min.
                    super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  local_178.m_min = (pointer)0x0;
                }
                local_178.m_type = &(local_180->m_valueRange).m_type;
                if (local_178.m_max ==
                    (local_180->m_valueRange).m_max.
                    super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  local_178.m_max = (pointer)0x0;
                }
                local_158.m_min =
                     (pVVar5->m_valueRange).m_min.
                     super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                     super__Vector_impl_data._M_start;
                local_158.m_max =
                     (pVVar5->m_valueRange).m_max.
                     super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                     super__Vector_impl_data._M_start;
                if (local_158.m_min ==
                    (pVVar5->m_valueRange).m_min.
                    super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  local_158.m_min = (pointer)0x0;
                }
                if (local_158.m_max ==
                    (pVVar5->m_valueRange).m_max.
                    super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  local_158.m_max = (pointer)0x0;
                }
                local_158.m_type = &(pVVar5->m_valueRange).m_type;
                ValueRange::computeIntersection(&local_b0,&local_178,&local_158);
                this_00 = local_190;
                local_178.m_type = &local_1a0->m_type;
                _Var12 = std::
                         __find_if<__gnu_cxx::__normal_iterator<rsg::ValueEntry*const*,std::vector<rsg::ValueEntry*,std::allocator<rsg::ValueEntry*>>>,__gnu_cxx::__ops::_Iter_equals_val<rsg::CompareEntryVariable_const>>
                                   ((local_190->m_entries).
                                    super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (local_190->m_entries).
                                    super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,&local_178);
                if ((_Var12._M_current ==
                     (this_00->m_entries).
                     super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish) ||
                   (*_Var12._M_current == (ValueEntry *)0x0)) {
                  ValueScope::allocate(this_00,local_1a0);
                  this_00 = local_190;
                }
                pSStack_120 = local_b0.m_min.
                              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                              super__Vector_impl_data._M_start;
                if (local_b0.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                    _M_impl.super__Vector_impl_data._M_start ==
                    local_b0.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
                  pSStack_120 = (pointer)0x0;
                }
                local_118 = local_b0.m_max.
                            super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                            super__Vector_impl_data._M_start;
                if (local_b0.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                    _M_impl.super__Vector_impl_data._M_start ==
                    local_b0.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
                  local_118 = (Scalar *)0x0;
                }
                local_128 = (Variable **)&local_b0;
                value.m_min = pSStack_120;
                value.m_type = (VariableType *)local_128;
                value.m_max = local_118;
                ValueScope::setValue(this_00,local_1a0,value);
                local_178.m_type = &local_1a0->m_type;
                _Var12 = std::
                         __find_if<__gnu_cxx::__normal_iterator<rsg::ValueEntry*const*,std::vector<rsg::ValueEntry*,std::allocator<rsg::ValueEntry*>>>,__gnu_cxx::__ops::_Iter_equals_val<rsg::CompareEntryVariable_const>>
                                   ((this_00->m_entries).
                                    super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (this_00->m_entries).
                                    super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,&local_178);
                if (_Var12._M_current ==
                    (local_190->m_entries).
                    super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
                  local_158.m_type = (VariableType *)0x0;
                }
                else {
                  local_158.m_type = (VariableType *)*_Var12._M_current;
                }
                std::vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>>::
                emplace_back<rsg::ValueEntry_const*>(local_188,(ValueEntry **)&local_158);
                ValueRange::~ValueRange(&local_b0);
              }
              std::
              _Rb_tree<rsg::Variable_const*,rsg::Variable_const*,std::_Identity<rsg::Variable_const*>,std::less<rsg::Variable_const*>,std::allocator<rsg::Variable_const*>>
              ::_M_insert_unique<rsg::Variable_const*const&>
                        ((_Rb_tree<rsg::Variable_const*,rsg::Variable_const*,std::_Identity<rsg::Variable_const*>,std::less<rsg::Variable_const*>,std::allocator<rsg::Variable_const*>>
                          *)&local_e0,&local_1a0);
              ppVVar14 = (pVVar6->m_entries).
                         super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
            }
            else {
              do {
                p_Var18 = p_Var19;
                p_Var15 = p_Var10;
                pVVar7 = *(Variable **)(p_Var15 + 1);
                p_Var19 = p_Var15;
                if (pVVar7 < local_1a0) {
                  p_Var19 = p_Var18;
                }
                p_Var10 = (&p_Var15->_M_left)[pVVar7 < local_1a0];
              } while ((&p_Var15->_M_left)[pVVar7 < local_1a0] != (_Base_ptr)0x0);
              if ((_Rb_tree_header *)p_Var19 == p_Var2) goto LAB_005ab3e3;
              if (pVVar7 < local_1a0) {
                p_Var15 = p_Var18;
              }
              if (local_1a0 < *(Variable **)(p_Var15 + 1)) goto LAB_005ab3e3;
            }
            ppVVar20 = ppVVar20 + 1;
            ppVVar17 = local_160;
          } while (ppVVar20 != ppVVar14);
          ppVVar13 = (this->m_valueScopeStack).
                     super__Vector_base<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
        }
        ppVVar17 = ppVVar17 + -1;
      } while (ppVVar17 != ppVVar13);
      ppVVar20 = (local_198->m_entries).
                 super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    }
    ppVVar14 = (local_198->m_entries).
               super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (ppVVar14 != ppVVar20) {
      do {
        pVVar8 = *ppVVar14;
        pVVar7 = pVVar8->m_variable;
        p_Var10 = local_e0._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var19 = &p_Var2->_M_header;
        if (local_e0._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_005ab6a4:
          pSStack_138 = (pVVar8->m_valueRange).m_min.
                        super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                        super__Vector_impl_data._M_start;
          local_130 = (pVVar8->m_valueRange).m_max.
                      super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                      super__Vector_impl_data._M_start;
          if (pSStack_138 ==
              (pVVar8->m_valueRange).m_min.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pSStack_138 = (Scalar *)0x0;
          }
          if (local_130 ==
              (pVVar8->m_valueRange).m_max.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_130 = (Scalar *)0x0;
          }
          local_140 = &pVVar8->m_valueRange;
          value_00.m_min = pSStack_138;
          value_00.m_type = &local_140->m_type;
          value_00.m_max = local_130;
          setValue(this,pVVar7,value_00);
          ppVVar20 = (local_198->m_entries).
                     super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          do {
            p_Var18 = p_Var19;
            p_Var15 = p_Var10;
            pVVar9 = *(Variable **)(p_Var15 + 1);
            p_Var19 = p_Var15;
            if (pVVar9 < pVVar7) {
              p_Var19 = p_Var18;
            }
            p_Var10 = (&p_Var15->_M_left)[pVVar9 < pVVar7];
          } while ((&p_Var15->_M_left)[pVVar9 < pVVar7] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var19 == p_Var2) goto LAB_005ab6a4;
          if (pVVar9 < pVVar7) {
            p_Var15 = p_Var18;
          }
          if (pVVar7 < *(Variable **)(p_Var15 + 1)) goto LAB_005ab6a4;
        }
        ppVVar14 = ppVVar14 + 1;
      } while (ppVVar14 != ppVVar20);
    }
    std::
    _Rb_tree<const_rsg::Variable_*,_const_rsg::Variable_*,_std::_Identity<const_rsg::Variable_*>,_std::less<const_rsg::Variable_*>,_std::allocator<const_rsg::Variable_*>_>
    ::~_Rb_tree(&local_e0);
    std::
    _Rb_tree<const_rsg::Variable_*,_std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>,_std::_Select1st<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>_>
    ::~_Rb_tree(&local_110);
  }
  return;
}

Assistant:

void VariableManager::popValueScope (void)
{
	ValueScope& oldScope = getCurValueScope();

	// Pop scope and clear cache.
	m_valueScopeStack.pop_back();
	m_entryCache.clear();

	// Re-build entry cache.
	if (!m_valueScopeStack.empty())
	{
		ValueScope& newTopScope = getCurValueScope();

		// Speed up computing intersections.
		map<const Variable*, const ValueEntry*>	oldValues;
		const vector<ValueEntry*>&				oldEntries = oldScope.getValues();

		for (vector<ValueEntry*>::const_iterator valueIter = oldEntries.begin(); valueIter != oldEntries.end(); valueIter++)
			oldValues[(*valueIter)->getVariable()] = *valueIter;

		set<const Variable*> addedVars;

		// Re-build based on current stack.
		for (vector<ValueScope*>::reverse_iterator scopeIter = m_valueScopeStack.rbegin(); scopeIter != m_valueScopeStack.rend(); scopeIter++)
		{
			const ValueScope*			scope			= *scopeIter;
			const vector<ValueEntry*>&	valueEntries	= scope->getValues();

			for (vector<ValueEntry*>::const_iterator valueIter = valueEntries.begin(); valueIter != valueEntries.end(); valueIter++)
			{
				const ValueEntry*	entry	= *valueIter;
				const Variable*		var		= entry->getVariable();

				if (addedVars.find(var) != addedVars.end())
					continue; // Already in cache, set deeper in scope stack.

				DE_ASSERT(std::find(m_entryCache.begin(), m_entryCache.end(), CompareEntryVariable(var)) == m_entryCache.end());

				if (oldValues.find(var) != oldValues.end())
				{
					const ValueEntry* oldEntry = oldValues[var];

					// Build new intersected value and store into current scope.
					ValueRange intersectedValue(var->getType());
					DE_ASSERT(oldEntry->getValueRange().intersects(entry->getValueRange())); // Must intersect
					ValueRange::computeIntersection(intersectedValue, entry->getValueRange(), oldEntry->getValueRange());

					if (!newTopScope.findEntry(var))
						newTopScope.allocate(var);

					newTopScope.setValue(var, intersectedValue.asAccess());

					// Add entry from top scope to cache.
					m_entryCache.push_back(newTopScope.findEntry(var));
				}
				else
					m_entryCache.push_back(entry); // Just add to cache.

				addedVars.insert(var); // Record as cached variable.
			}
		}

		// Copy entries from popped scope that don't yet exist in the stack.
		for (vector<ValueEntry*>::const_iterator valueIter = oldEntries.begin(); valueIter != oldEntries.end(); valueIter++)
		{
			const ValueEntry*	oldEntry	= *valueIter;
			const Variable*		var			= oldEntry->getVariable();

			if (addedVars.find(var) == addedVars.end())
				setValue(var, oldEntry->getValueRange());
		}
	}
}